

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.h
# Opt level: O2

uint __thiscall CVmObjStringBuffer::calc_hash(CVmObjStringBuffer *this,vm_obj_id_t self,int param_2)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  piVar1 = (int *)(this->super_CVmObject).ext_;
  iVar3 = *piVar1;
  lVar4 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  uVar2 = 0;
  for (; iVar3 != (int)lVar4; lVar4 = lVar4 + 1) {
    uVar2 = uVar2 + piVar1[lVar4 + 3];
  }
  return uVar2;
}

Assistant:

vm_strbuf_ext *get_ext() const { return (vm_strbuf_ext *)ext_; }